

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

int c_vsnprintf(char *buf,size_t buf_size,char *fmt,__va_list_tag *ap)

{
  char cVar1;
  uint uVar2;
  int64_t num;
  long *plVar3;
  char *pcVar4;
  ulong *puVar5;
  int64_t *piVar6;
  long lVar7;
  byte bVar8;
  int iVar9;
  int *piVar10;
  uint *puVar11;
  byte bVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  byte *pbVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  bool bVar22;
  bool bVar23;
  
  iVar21 = (int)buf_size;
  uVar20 = 0;
LAB_001091be:
  do {
    bVar8 = *fmt;
    fmt = (char *)((byte *)fmt + 1);
    iVar19 = (int)uVar20;
    if (bVar8 == 0x25) {
      bVar8 = *fmt;
      bVar22 = bVar8 == 0x30;
      iVar18 = 0;
      if ((byte)(bVar8 - 0x30) < 10) {
        iVar18 = 0;
        do {
          iVar18 = (uint)(byte)(bVar8 - 0x30) + iVar18 * 10;
          bVar8 = ((byte *)fmt)[1];
          fmt = (char *)((byte *)fmt + 1);
        } while ((byte)(bVar8 - 0x30) < 10);
      }
      if (bVar8 == 0x2a) {
        uVar2 = ap->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          piVar10 = (int *)((ulong)uVar2 + (long)ap->reg_save_area);
          ap->gp_offset = uVar2 + 8;
        }
        else {
          piVar10 = (int *)ap->overflow_arg_area;
          ap->overflow_arg_area = piVar10 + 2;
        }
        iVar18 = *piVar10;
        fmt = (char *)((byte *)fmt + 1);
      }
      if (*fmt == 0x2e) {
        if (((byte *)fmt)[1] == 0x2a) {
          uVar2 = ap->gp_offset;
          if ((ulong)uVar2 < 0x29) {
            puVar11 = (uint *)((ulong)uVar2 + (long)ap->reg_save_area);
            ap->gp_offset = uVar2 + 8;
          }
          else {
            puVar11 = (uint *)ap->overflow_arg_area;
            ap->overflow_arg_area = puVar11 + 2;
          }
          uVar20 = (ulong)*puVar11;
          fmt = (char *)((byte *)fmt + 2);
        }
        else {
          fmt = (char *)((byte *)fmt + 1);
          bVar8 = *fmt;
          if (9 < (byte)(bVar8 - 0x30)) goto LAB_001092af;
          uVar20 = 0;
          do {
            uVar20 = (ulong)((uint)(byte)(bVar8 - 0x30) + (int)uVar20 * 10);
            bVar8 = ((byte *)fmt)[1];
            fmt = (char *)((byte *)fmt + 1);
          } while ((byte)(bVar8 - 0x30) < 10);
        }
      }
      else {
LAB_001092af:
        uVar20 = 0;
      }
      bVar8 = *fmt;
      bVar12 = 0;
      if ((bVar8 - 0x49 < 0x32) &&
         (bVar12 = 0, (0x2090a80000009U >> ((ulong)(bVar8 - 0x49) & 0x3f) & 1) != 0)) {
        bVar23 = ((byte *)fmt)[1] == 0x68;
        if (bVar23) {
          bVar8 = 0x48;
        }
        pbVar17 = (byte *)fmt + 1;
        if (bVar23) {
          pbVar17 = (byte *)fmt + 2;
        }
        bVar12 = bVar8;
        if (((byte *)fmt)[(ulong)bVar23 + 1] == 0x6c) {
          bVar12 = 0x71;
        }
        fmt = (char *)(pbVar17 + (((byte *)fmt)[(ulong)bVar23 + 1] == 0x6c));
      }
      bVar8 = *fmt;
      fmt = (char *)((byte *)fmt + 1);
      if (bVar8 != 99) {
        if (bVar8 == 0x73) {
          uVar2 = ap->gp_offset;
          if ((ulong)uVar2 < 0x29) {
            plVar3 = (long *)((ulong)uVar2 + (long)ap->reg_save_area);
            ap->gp_offset = uVar2 + 8;
          }
          else {
            plVar3 = (long *)ap->overflow_arg_area;
            ap->overflow_arg_area = plVar3 + 1;
          }
          lVar7 = *plVar3;
          iVar9 = (int)uVar20;
          uVar14 = 0;
          if ((-1 < iVar9) && (iVar9 != 0)) {
            uVar13 = 0;
            do {
              uVar14 = uVar13;
              if (*(char *)(lVar7 + uVar13) == '\0') break;
              uVar13 = uVar13 + 1;
              uVar14 = uVar20;
            } while (uVar20 != uVar13);
          }
          if (0 < iVar18 - (int)uVar14) {
            lVar15 = (long)iVar19;
            iVar16 = 0;
            do {
              if (lVar15 < iVar21) {
                buf[lVar15] = ' ';
              }
              lVar15 = lVar15 + 1;
              iVar16 = iVar16 + -1;
            } while ((int)uVar14 - iVar18 != iVar16);
            iVar19 = iVar19 - iVar16;
          }
          uVar20 = (ulong)iVar19;
          lVar15 = 0;
          do {
            cVar1 = *(char *)(lVar7 + lVar15);
            if (cVar1 == '\0') break;
            if ((long)uVar20 < (long)iVar21) {
              buf[uVar20] = cVar1;
            }
            uVar20 = uVar20 + 1;
            lVar15 = lVar15 + 1;
          } while ((int)lVar15 < iVar9 || iVar9 < 1);
          goto LAB_001091be;
        }
        if ((bVar8 == 100) && (bVar12 == 0)) {
          uVar2 = ap->gp_offset;
          if ((ulong)uVar2 < 0x29) {
            piVar10 = (int *)((ulong)uVar2 + (long)ap->reg_save_area);
            ap->gp_offset = uVar2 + 8;
          }
          else {
            piVar10 = (int *)ap->overflow_arg_area;
            ap->overflow_arg_area = piVar10 + 2;
          }
          uVar20 = (ulong)*piVar10;
LAB_001094d2:
          iVar9 = 10;
        }
        else {
          if (((bVar8 == 100) && (bVar12 == 0x6c)) || ((bVar8 == 100 && (bVar12 == 0x71)))) {
            uVar2 = ap->gp_offset;
            if ((ulong)uVar2 < 0x29) {
              puVar5 = (ulong *)((ulong)uVar2 + (long)ap->reg_save_area);
              ap->gp_offset = uVar2 + 8;
            }
            else {
              puVar5 = (ulong *)ap->overflow_arg_area;
              ap->overflow_arg_area = puVar5 + 1;
            }
            uVar20 = *puVar5;
            goto LAB_001094d2;
          }
          if ((bVar8 != 0x75 && bVar8 != 0x78) || (bVar12 != 0)) {
            if (bVar8 != 0x75 && bVar8 != 0x78 || bVar12 != 0x6c) {
              if (bVar8 != 0x70) {
                abort();
              }
              uVar2 = ap->gp_offset;
              if ((ulong)uVar2 < 0x29) {
                piVar6 = (int64_t *)((ulong)uVar2 + (long)ap->reg_save_area);
                ap->gp_offset = uVar2 + 8;
              }
              else {
                piVar6 = (int64_t *)ap->overflow_arg_area;
                ap->overflow_arg_area = piVar6 + 1;
              }
              num = *piVar6;
              if (iVar19 < iVar21) {
                buf[iVar19] = '0';
              }
              lVar7 = (long)iVar19;
              if ((int)(lVar7 + 1) < iVar21) {
                buf[lVar7 + 1] = 'x';
              }
              iVar18 = c_itoa(buf + lVar7 + 2,buf_size - (lVar7 + 2),num,0x10,(uint)bVar22,0);
              uVar20 = (ulong)(iVar19 + iVar18 + 2);
              goto LAB_001091be;
            }
            uVar2 = ap->gp_offset;
            if ((ulong)uVar2 < 0x29) {
              puVar5 = (ulong *)((ulong)uVar2 + (long)ap->reg_save_area);
              ap->gp_offset = uVar2 + 8;
            }
            else {
              puVar5 = (ulong *)ap->overflow_arg_area;
              ap->overflow_arg_area = puVar5 + 1;
            }
            uVar20 = *puVar5;
          }
          else {
            uVar2 = ap->gp_offset;
            if ((ulong)uVar2 < 0x29) {
              puVar11 = (uint *)((ulong)uVar2 + (long)ap->reg_save_area);
              ap->gp_offset = uVar2 + 8;
            }
            else {
              puVar11 = (uint *)ap->overflow_arg_area;
              ap->overflow_arg_area = puVar11 + 2;
            }
            uVar20 = (ulong)*puVar11;
          }
          iVar9 = 10;
          if (bVar8 == 0x78) {
            iVar9 = 0x10;
          }
        }
        iVar18 = c_itoa(buf + iVar19,buf_size - (long)iVar19,uVar20,iVar9,(uint)bVar22,iVar18);
        uVar20 = (ulong)(uint)(iVar19 + iVar18);
        goto LAB_001091be;
      }
      uVar2 = ap->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        pcVar4 = (char *)((ulong)uVar2 + (long)ap->reg_save_area);
        ap->gp_offset = uVar2 + 8;
      }
      else {
        pcVar4 = (char *)ap->overflow_arg_area;
        ap->overflow_arg_area = pcVar4 + 8;
      }
      if (iVar19 < iVar21) {
        buf[iVar19] = *pcVar4;
      }
    }
    else {
      if (bVar8 == 0) {
        if (buf_size != 0) {
          iVar18 = iVar21 + -1;
          if (iVar19 < iVar21) {
            iVar18 = iVar19;
          }
          buf[iVar18] = '\0';
        }
        return iVar19;
      }
      if (iVar19 < iVar21) {
        buf[iVar19] = bVar8;
      }
    }
    uVar20 = (ulong)(iVar19 + 1);
  } while( true );
}

Assistant:

int c_vsnprintf(char *buf, size_t buf_size, const char *fmt, va_list ap) {
    int ch, i = 0, len_mod, flags, precision, field_width;

    while ((ch = *fmt++) != '\0') {
        if (ch != '%') {
            C_SNPRINTF_APPEND_CHAR(ch);
        } else {
            /*
       * Conversion specification:
       *   zero or more flags (one of: # 0 - <space> + ')
       *   an optional minimum  field  width (digits)
       *   an  optional precision (. followed by digits, or *)
       *   an optional length modifier (one of: hh h l ll L q j z t)
       *   conversion specifier (one of: d i o u x X e E f F g G a A c s p n)
       */
            flags = field_width = precision = len_mod = 0;

            /* Flags. only zero-pad flag is supported. */
            if (*fmt == '0') {
                flags |= C_SNPRINTF_FLAG_ZERO;
            }

            /* Field width */
            while (*fmt >= '0' && *fmt <= '9') {
                field_width *= 10;
                field_width += *fmt++ - '0';
            }
            /* Dynamic field width */
            if (*fmt == '*') {
                field_width = va_arg(ap, int);
                fmt++;
            }

            /* Precision */
            if (*fmt == '.') {
                fmt++;
                if (*fmt == '*') {
                    precision = va_arg(ap, int);
                    fmt++;
                } else {
                    while (*fmt >= '0' && *fmt <= '9') {
                        precision *= 10;
                        precision += *fmt++ - '0';
                    }
                }
            }

            /* Length modifier */
            switch (*fmt) {
                case 'h':
                case 'l':
                case 'L':
                case 'I':
                case 'q':
                case 'j':
                case 'z':
                case 't':
                    len_mod = *fmt++;
                    if (*fmt == 'h') {
                        len_mod = 'H';
                        fmt++;
                    }
                    if (*fmt == 'l') {
                        len_mod = 'q';
                        fmt++;
                    }
                    break;
            }

            ch = *fmt++;
            if (ch == 's') {
                const char *s = va_arg(ap, const char *); /* Always fetch parameter */
                int j;
                int pad = field_width - (precision >= 0 ? strnlen(s, precision) : 0);
                for (j = 0; j < pad; j++) {
                    C_SNPRINTF_APPEND_CHAR(' ');
                }

                /* Ignore negative and 0 precisions */
                for (j = 0; (precision <= 0 || j < precision) && s[j] != '\0'; j++) {
                    C_SNPRINTF_APPEND_CHAR(s[j]);
                }
            } else if (ch == 'c') {
                ch = va_arg(ap, int); /* Always fetch parameter */
                C_SNPRINTF_APPEND_CHAR(ch);
            } else if (ch == 'd' && len_mod == 0) {
                i += c_itoa(buf + i, buf_size - i, va_arg(ap, int), 10, flags,
                            field_width);
            } else if (ch == 'd' && len_mod == 'l') {
                i += c_itoa(buf + i, buf_size - i, va_arg(ap, long), 10, flags,
                            field_width);
            } else if (ch == 'd' && len_mod == 'q') {
                i += c_itoa(buf + i, buf_size - i, va_arg(ap, int64_t), 10, flags,
                            field_width);
            } else if ((ch == 'x' || ch == 'u') && len_mod == 0) {
                i += c_itoa(buf + i, buf_size - i, va_arg(ap, unsigned),
                            ch == 'x' ? 16 : 10, flags, field_width);
            } else if ((ch == 'x' || ch == 'u') && len_mod == 'l') {
                i += c_itoa(buf + i, buf_size - i, va_arg(ap, unsigned long),
                            ch == 'x' ? 16 : 10, flags, field_width);
            } else if (ch == 'p') {
                unsigned long num = (unsigned long) va_arg(ap, void *);
                C_SNPRINTF_APPEND_CHAR('0');
                C_SNPRINTF_APPEND_CHAR('x');
                i += c_itoa(buf + i, buf_size - i, num, 16, flags, 0);
            } else {
#ifndef NO_LIBC
                /*
         * TODO(lsm): abort is not nice in a library, remove it
         * Also, ESP8266 SDK doesn't have it
         */
                abort();
#endif
            }
        }
    }

    /* Zero-terminate the result */
    if (buf_size > 0) {
        buf[i < (int) buf_size ? i : (int) buf_size - 1] = '\0';
    }

    return i;
}